

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

long __thiscall QByteArray::toLong(QByteArray *this,bool *ok,int base)

{
  QLocaleData *this_00;
  bool bVar1;
  long lVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  QByteArrayView num;
  QSimpleParsedNumber<long_long> QVar3;
  
  num.m_data._4_4_ = in_register_00000014;
  num.m_data._0_4_ = base;
  this_00 = (QLocaleData *)(this->d).size;
  if (this_00 == (QLocaleData *)0x0) {
    bVar1 = true;
    lVar2 = 0;
  }
  else {
    num.m_size = (qsizetype)(this->d).ptr;
    QVar3 = QLocaleData::bytearrayToLongLong(this_00,num,in_ECX);
    bVar1 = QVar3.used < 1;
    lVar2 = 0;
    if (0 < QVar3.used) {
      lVar2 = QVar3.result;
    }
  }
  if (ok != (bool *)0x0) {
    *ok = (bool)(bVar1 ^ 1);
  }
  if (bVar1) {
    lVar2 = 0;
  }
  return lVar2;
}

Assistant:

long QByteArray::toLong(bool *ok, int base) const
{
    return QtPrivate::toIntegral<long>(qToByteArrayViewIgnoringNull(*this), ok, base);
}